

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# throwable.cc
# Opt level: O0

t_pvalue __thiscall
xemmai::t_type_of<xemmai::t_throwable>::f_do_construct
          (t_type_of<xemmai::t_throwable> *this,t_pvalue *a_stack,size_t a_n)

{
  size_t in_RCX;
  t_pvalue tVar1;
  size_t a_n_local;
  t_pvalue *a_stack_local;
  t_type_of<xemmai::t_throwable> *this_local;
  
  tVar1 = t_construct_with<xemmai::t_object_*(*)(xemmai::t_type_of<xemmai::t_object>_*,_std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_&&),_&xemmai::t_construct<std::basic_string_view<wchar_t>>::(anonymous_class)::__invoke>
          ::f_do((t_construct_with<xemmai::t_object_*(*)(xemmai::t_type_of<xemmai::t_object>_*,_std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_&&),_&xemmai::t_construct<std::basic_string_view<wchar_t>>::(anonymous_class)::__invoke>
                  *)this,(t_type *)a_stack,(t_pvalue *)a_n,in_RCX);
  tVar1.super_t_pointer.v_p = (t_object *)this;
  return tVar1;
}

Assistant:

t_pvalue t_type_of<t_throwable>::f_do_construct(t_pvalue* a_stack, size_t a_n)
{
	return t_construct<std::wstring_view>::t_bind<t_throwable>::f_do(this, a_stack, a_n);
}